

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

char * testing::internal::CodePointToUtf8(UInt32 code_point,char *str)

{
  UInt32 UVar1;
  byte *in_RSI;
  uint in_EDI;
  String *this;
  String local_20;
  byte *local_10;
  uint local_4;
  
  local_10 = in_RSI;
  if (in_EDI < 0x80) {
    in_RSI[1] = 0;
    *in_RSI = (byte)in_EDI;
  }
  else {
    local_4 = in_EDI;
    if (in_EDI < 0x800) {
      in_RSI[2] = 0;
      UVar1 = ChopLowBits(&local_4,6);
      local_10[1] = (byte)UVar1 | 0x80;
      *local_10 = (byte)local_4 | 0xc0;
    }
    else if (in_EDI < 0x10000) {
      in_RSI[3] = 0;
      UVar1 = ChopLowBits(&local_4,6);
      local_10[2] = (byte)UVar1 | 0x80;
      UVar1 = ChopLowBits(&local_4,6);
      local_10[1] = (byte)UVar1 | 0x80;
      *local_10 = (byte)local_4 | 0xe0;
    }
    else if (in_EDI < 0x200000) {
      in_RSI[4] = 0;
      UVar1 = ChopLowBits(&local_4,6);
      local_10[3] = (byte)UVar1 | 0x80;
      UVar1 = ChopLowBits(&local_4,6);
      local_10[2] = (byte)UVar1 | 0x80;
      UVar1 = ChopLowBits(&local_4,6);
      local_10[1] = (byte)UVar1 | 0x80;
      *local_10 = (byte)local_4 | 0xf0;
    }
    else {
      this = &local_20;
      String::Format((char *)this,"(Invalid Unicode 0x%X)",(ulong)in_EDI);
      String::c_str(this);
      posix::StrNCpy((char *)this,(char *)in_RSI,0x14ffd7);
      String::~String(this);
      local_10[0x1f] = 0;
    }
  }
  return (char *)local_10;
}

Assistant:

char* CodePointToUtf8(UInt32 code_point, char* str) {
  if (code_point <= kMaxCodePoint1) {
    str[1] = '\0';
    str[0] = static_cast<char>(code_point);                          // 0xxxxxxx
  } else if (code_point <= kMaxCodePoint2) {
    str[2] = '\0';
    str[1] = static_cast<char>(0x80 | ChopLowBits(&code_point, 6));  // 10xxxxxx
    str[0] = static_cast<char>(0xC0 | code_point);                   // 110xxxxx
  } else if (code_point <= kMaxCodePoint3) {
    str[3] = '\0';
    str[2] = static_cast<char>(0x80 | ChopLowBits(&code_point, 6));  // 10xxxxxx
    str[1] = static_cast<char>(0x80 | ChopLowBits(&code_point, 6));  // 10xxxxxx
    str[0] = static_cast<char>(0xE0 | code_point);                   // 1110xxxx
  } else if (code_point <= kMaxCodePoint4) {
    str[4] = '\0';
    str[3] = static_cast<char>(0x80 | ChopLowBits(&code_point, 6));  // 10xxxxxx
    str[2] = static_cast<char>(0x80 | ChopLowBits(&code_point, 6));  // 10xxxxxx
    str[1] = static_cast<char>(0x80 | ChopLowBits(&code_point, 6));  // 10xxxxxx
    str[0] = static_cast<char>(0xF0 | code_point);                   // 11110xxx
  } else {
    // The longest string String::Format can produce when invoked
    // with these parameters is 28 character long (not including
    // the terminating nul character). We are asking for 32 character
    // buffer just in case. This is also enough for strncpy to
    // null-terminate the destination string.
    posix::StrNCpy(
        str, String::Format("(Invalid Unicode 0x%X)", code_point).c_str(), 32);
    str[31] = '\0';  // Makes sure no change in the format to strncpy leaves
                     // the result unterminated.
  }
  return str;
}